

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cTransformFeedbackOverflowQueryTests.cpp
# Opt level: O0

void __thiscall
gl3cts::TransformFeedbackOverflowQueryStateUpdate::deinit
          (TransformFeedbackOverflowQueryStateUpdate *this)

{
  int iVar1;
  RenderContext *pRVar2;
  undefined4 extraout_var;
  Functions *gl;
  TransformFeedbackOverflowQueryStateUpdate *this_local;
  
  pRVar2 = deqp::Context::getRenderContext
                     ((this->super_TransformFeedbackOverflowQueryContextStateBase).
                      super_TransformFeedbackOverflowQueryBaseTest.super_TestCase.m_context);
  iVar1 = (*pRVar2->_vptr_RenderContext[3])();
  (**(code **)(CONCAT44(extraout_var,iVar1) + 0x458))(1,&this->m_overflow_query);
  (**(code **)(CONCAT44(extraout_var,iVar1) + 0x458))(1,&this->m_stream_overflow_query);
  tcu::TestNode::deinit((TestNode *)this);
  return;
}

Assistant:

virtual void deinit()
	{
		const glw::Functions& gl = m_context.getRenderContext().getFunctions();

		gl.deleteQueries(1, &m_overflow_query);
		gl.deleteQueries(1, &m_stream_overflow_query);

		TransformFeedbackOverflowQueryContextStateBase::deinit();
	}